

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O3

Gia_Man_t * Gia_QbfCofactor(Gia_Man_t *p,int nPars,Vec_Int_t *vValues,Vec_Int_t *vParMap)

{
  uint uVar1;
  char *__s;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  uint uVar5;
  Gia_Man_t *p_00;
  size_t sVar6;
  char *__dest;
  long lVar7;
  Gia_Obj_t *pGVar8;
  Vec_Int_t *pVVar9;
  Gia_Man_t *pGVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  
  if (p->vCis->nSize - p->nRegs != vValues->nSize + nPars) {
    __assert_fail("Gia_ManPiNum(p) == nPars + Vec_IntSize(vValues)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaQbf.c"
                  ,0x266,"Gia_Man_t *Gia_QbfCofactor(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *)");
  }
  p_00 = Gia_ManStart(p->nObjs);
  __s = p->pName;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar6 = strlen(__s);
    __dest = (char *)malloc(sVar6 + 1);
    strcpy(__dest,__s);
  }
  p_00->pName = __dest;
  Gia_ManHashAlloc(p_00);
  p->pObjs->Value = 0;
  pVVar9 = p->vCis;
  uVar11 = (ulong)(uint)pVVar9->nSize;
  if (p->nRegs < pVVar9->nSize) {
    lVar12 = (long)nPars;
    lVar13 = 0;
    do {
      if ((int)uVar11 <= lVar13) {
LAB_00797d39:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      lVar7 = (long)pVVar9->pArray[lVar13];
      if ((lVar7 < 0) || (p->nObjs <= pVVar9->pArray[lVar13])) goto LAB_00797d1a;
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      if (lVar13 < lVar12) {
        pGVar8 = Gia_ManAppendObj(p_00);
        uVar11 = *(ulong *)pGVar8;
        *(ulong *)pGVar8 = uVar11 | 0x9fffffff;
        *(ulong *)pGVar8 =
             uVar11 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar3 = p_00->pObjs;
        if ((pGVar8 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar8)) {
LAB_00797d77:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar3) >> 2) * -0x55555555);
        pGVar3 = p_00->pObjs;
        if ((pGVar8 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar8)) goto LAB_00797d77;
        pGVar2[lVar7].Value = (int)((ulong)((long)pGVar8 - (long)pGVar3) >> 2) * 0x55555556;
        if (vParMap->nSize <= lVar13) goto LAB_00797d39;
        uVar5 = vParMap->pArray[lVar13];
        if (uVar5 != 0xffffffff) goto LAB_00797b8e;
      }
      else {
        if ((lVar13 - lVar12 < 0) || ((long)vValues->nSize <= lVar13 - lVar12)) goto LAB_00797d39;
        uVar5 = vValues->pArray[lVar13 - lVar12];
LAB_00797b8e:
        pGVar2[lVar7].Value = uVar5;
      }
      lVar13 = lVar13 + 1;
      pVVar9 = p->vCis;
      uVar11 = (ulong)pVVar9->nSize;
    } while (lVar13 < (long)(uVar11 - (long)p->nRegs));
  }
  iVar4 = p->nObjs;
  if (0 < iVar4) {
    lVar12 = 8;
    lVar13 = 0;
    do {
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      uVar11 = *(ulong *)((long)pGVar2 + lVar12 + -8);
      if ((uVar11 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar11) {
        uVar5 = *(uint *)((long)pGVar2 +
                         lVar12 + (ulong)(uint)((int)(uVar11 & 0x1fffffff) << 2) * -3);
        if (((int)uVar5 < 0) ||
           (uVar1 = *(uint *)((long)pGVar2 +
                             lVar12 + (ulong)((uint)(uVar11 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar1 < 0)) goto LAB_00797d58;
        iVar4 = Gia_ManHashAnd(p_00,uVar5 ^ (uint)(uVar11 >> 0x1d) & 1,
                               uVar1 ^ (uint)(uVar11 >> 0x3d) & 1);
        *(int *)(&pGVar2->field_0x0 + lVar12) = iVar4;
        iVar4 = p->nObjs;
      }
      lVar13 = lVar13 + 1;
      lVar12 = lVar12 + 0xc;
    } while (lVar13 < iVar4);
  }
  pVVar9 = p->vCos;
  if (0 < pVVar9->nSize) {
    lVar12 = 0;
    do {
      iVar4 = pVVar9->pArray[lVar12];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) {
LAB_00797d1a:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar2 = p->pObjs + iVar4;
      if ((int)pGVar2[-(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)].Value < 0) {
LAB_00797d58:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar5 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar2 >> 0x1d & 1 ^
                                   pGVar2[-(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)].Value)
      ;
      pGVar2->Value = uVar5;
      lVar12 = lVar12 + 1;
      pVVar9 = p->vCos;
    } while (lVar12 < pVVar9->nSize);
  }
  pGVar10 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  if (pGVar10->vCis->nSize - pGVar10->nRegs != nPars) {
    __assert_fail("Gia_ManPiNum(pNew) == nPars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaQbf.c"
                  ,0x27a,"Gia_Man_t *Gia_QbfCofactor(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *)");
  }
  return pGVar10;
}

Assistant:

Gia_Man_t * Gia_QbfCofactor( Gia_Man_t * p, int nPars, Vec_Int_t * vValues, Vec_Int_t * vParMap )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj; int i;
    assert( Gia_ManPiNum(p) == nPars + Vec_IntSize(vValues) );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachPi( p, pObj, i )
        if ( i < nPars )
        {
            pObj->Value = Gia_ManAppendCi(pNew);
            if ( Vec_IntEntry(vParMap, i) != -1 )
                pObj->Value = Vec_IntEntry(vParMap, i);
        }
        else
            pObj->Value = Vec_IntEntry(vValues, i - nPars);
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    assert( Gia_ManPiNum(pNew) == nPars );
    return pNew;
}